

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64-gen.c
# Opt level: O2

int oad(int c,int s)

{
  int iVar1;
  
  iVar1 = s;
  if (nocode_wanted == 0) {
    o(c);
    iVar1 = ind;
    gen_le32(s);
  }
  return iVar1;
}

Assistant:

static int oad(int c, int s) {
  int t;
  if (nocode_wanted)
    return s;
  o(c);
  t = ind;
  gen_le32(s);
  return t;
}